

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 iPatternMatch(void *pText,sxu32 nLen,void *pPattern,sxu32 iPatLen,sxu32 *pOfft)

{
  char cVar1;
  char cVar2;
  __int32_t *p_Var3;
  __int32_t **pp_Var4;
  char *pcVar5;
  char *zpIn;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *zIn;
  
  if (iPatLen <= nLen) {
    pcVar7 = (char *)((long)pText + 1);
    for (pcVar8 = (char *)pText; pcVar8 < (char *)((ulong)nLen + (long)pText); pcVar8 = pcVar8 + 1)
    {
      pp_Var4 = __ctype_tolower_loc();
      p_Var3 = *pp_Var4;
      pcVar5 = pcVar7;
      pcVar6 = (char *)((long)pPattern + 1);
      if (p_Var3[*pcVar8] == p_Var3[*pPattern]) {
        do {
          if ((char *)((ulong)iPatLen + (long)pPattern) <= pcVar6) {
            if (pOfft != (sxu32 *)0x0) {
              *pOfft = (int)pcVar8 - (int)pText;
              return 0;
            }
            return 0;
          }
          if ((char *)((ulong)nLen + (long)pText) <= pcVar5) break;
          cVar1 = *pcVar5;
          cVar2 = *pcVar6;
          pcVar5 = pcVar5 + 1;
          pcVar6 = pcVar6 + 1;
        } while (p_Var3[cVar1] == p_Var3[cVar2]);
      }
      pcVar7 = pcVar7 + 1;
    }
  }
  return -6;
}

Assistant:

static sxi32 iPatternMatch(const void *pText, sxu32 nLen, const void *pPattern, sxu32 iPatLen, sxu32 *pOfft)
{
	const char *zpIn = (const char *)pPattern;
	const char *zIn = (const char *)pText;
	const char *zpEnd = &zpIn[iPatLen];
	const char *zEnd = &zIn[nLen];
	const char *zPtr, *zPtr2;
	int c, d;
	if( iPatLen > nLen ){
		/* Don't bother processing */
		return SXERR_NOTFOUND;
	}
	for(;;){
		if( zIn >= zEnd ){
			break;
		}
		c = SyToLower(zIn[0]);
		d = SyToLower(zpIn[0]);
		if( c == d ){
			zPtr   = &zIn[1];
			zPtr2  = &zpIn[1];
			for(;;){
				if( zPtr2 >= zpEnd ){
					/* Pattern found */
					if( pOfft ){ *pOfft = (sxu32)(zIn-(const char *)pText); }
					return SXRET_OK;
				}
				if( zPtr >= zEnd ){
					break;
				}
				c = SyToLower(zPtr[0]);
				d = SyToLower(zPtr2[0]);
				if( c != d ){
					break;
				}
				zPtr++; zPtr2++;
			}
		}
		zIn++;
	}
	/* Pattern not found */
	return SXERR_NOTFOUND;
}